

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unify_const_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::UnifyConstantPass::Process(UnifyConstantPass *this)

{
  uint32_t uVar1;
  Op OVar2;
  uint32_t uVar3;
  Status SVar4;
  DefUseManager *this_00;
  size_type sVar5;
  IRContext *pIVar6;
  undefined1 local_50 [4];
  uint32_t id;
  undefined1 local_38 [16];
  Instruction *inst;
  Instruction *next_instruction;
  ResultIdTrie defined_constants;
  bool modified;
  UnifyConstantPass *this_local;
  
  defined_constants.root_._M_t.
  super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
  .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
  _M_head_impl._7_1_ = 0;
  anon_unknown_8::ResultIdTrie::ResultIdTrie((ResultIdTrie *)&next_instruction);
  Pass::context(&this->super_Pass);
  IRContext::types_values_begin((IRContext *)local_38);
  local_38._8_8_ =
       utils::IntrusiveList<spvtools::opt::Instruction>::
       iterator_template<spvtools::opt::Instruction>::operator*
                 ((iterator_template<spvtools::opt::Instruction> *)local_38);
  while ((Instruction *)local_38._8_8_ != (Instruction *)0x0) {
    inst = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                     ((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_38._8_8_);
    this_00 = Pass::get_def_use_mgr(&this->super_Pass);
    uVar1 = opt::Instruction::result_id((Instruction *)local_38._8_8_);
    analysis::DefUseManager::GetAnnotations
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)local_50,this_00,uVar1);
    sVar5 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ::size((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)local_50);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            local_50);
    if ((sVar5 == 0) &&
       ((OVar2 = opt::Instruction::opcode((Instruction *)local_38._8_8_), OVar2 - OpConstantTrue < 6
        || (OVar2 == OpSpecConstantComposite || OVar2 == OpSpecConstantOp)))) {
      uVar1 = anon_unknown_8::ResultIdTrie::LookupEquivalentResultFor
                        ((ResultIdTrie *)&next_instruction,(Instruction *)local_38._8_8_);
      uVar3 = opt::Instruction::result_id((Instruction *)local_38._8_8_);
      if (uVar1 != uVar3) {
        pIVar6 = Pass::context(&this->super_Pass);
        uVar3 = opt::Instruction::result_id((Instruction *)local_38._8_8_);
        IRContext::ReplaceAllUsesWith(pIVar6,uVar3,uVar1);
        pIVar6 = Pass::context(&this->super_Pass);
        IRContext::KillInst(pIVar6,(Instruction *)local_38._8_8_);
        defined_constants.root_._M_t.
        super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
        .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
        _M_head_impl._7_1_ = 1;
      }
    }
    local_38._8_8_ = inst;
  }
  SVar4 = SuccessWithoutChange;
  if ((defined_constants.root_._M_t.
       super___uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
       .super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>.
       _M_head_impl._7_1_ & 1) != 0) {
    SVar4 = SuccessWithChange;
  }
  anon_unknown_8::ResultIdTrie::~ResultIdTrie((ResultIdTrie *)&next_instruction);
  return SVar4;
}

Assistant:

Pass::Status UnifyConstantPass::Process() {
  bool modified = false;
  ResultIdTrie defined_constants;

  for (Instruction *next_instruction,
       *inst = &*(context()->types_values_begin());
       inst; inst = next_instruction) {
    next_instruction = inst->NextNode();

    // Do not handle the instruction when there are decorations upon the result
    // id.
    if (get_def_use_mgr()->GetAnnotations(inst->result_id()).size() != 0) {
      continue;
    }

    // The overall algorithm is to store the result ids of all the eligible
    // constants encountered so far in a trie. For a constant defining
    // instruction under consideration, use its opcode, result type id and
    // words in operands as an array of keys to lookup the trie. If a result id
    // can be found for that array of keys, a constant with exactly the same
    // value must has been defined before, the constant under processing
    // should be replaced by the constant previously defined. If no such result
    // id can be found for that array of keys, this must be the first time a
    // constant with its value be defined, we then create a new trie node to
    // store the result id with the keys. When replacing a duplicated constant
    // with a previously defined constant, all the uses of the duplicated
    // constant, which must be placed after the duplicated constant defining
    // instruction, will be updated. This way, the descendants of the
    // previously defined constant and the duplicated constant will both refer
    // to the previously defined constant. So that the operand ids which are
    // used in key arrays will be the ids of the unified constants, when
    // processing is up to a descendant. This makes comparing the key array
    // always valid for judging duplication.
    switch (inst->opcode()) {
      case spv::Op::OpConstantTrue:
      case spv::Op::OpConstantFalse:
      case spv::Op::OpConstant:
      case spv::Op::OpConstantNull:
      case spv::Op::OpConstantSampler:
      case spv::Op::OpConstantComposite:
      // Only spec constants defined with OpSpecConstantOp and
      // OpSpecConstantComposite should be processed in this pass. Spec
      // constants defined with OpSpecConstant{|True|False} are decorated with
      // 'SpecId' decoration and all of them should be treated as unique.
      // 'SpecId' is not applicable to SpecConstants defined with
      // OpSpecConstant{Op|Composite}, their values are not necessary to be
      // unique. When all the operands/components are the same between two
      // OpSpecConstant{Op|Composite} results, their result values must be the
      // same so are unifiable.
      case spv::Op::OpSpecConstantOp:
      case spv::Op::OpSpecConstantComposite: {
        uint32_t id = defined_constants.LookupEquivalentResultFor(*inst);
        if (id != inst->result_id()) {
          // The constant is a duplicated one, use the cached constant to
          // replace the uses of this duplicated one, then turn it to nop.
          context()->ReplaceAllUsesWith(inst->result_id(), id);
          context()->KillInst(inst);
          modified = true;
        }
        break;
      }
      default:
        break;
    }
  }
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}